

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

int __thiscall vmtz_trans::compare_to(vmtz_trans *this,int32_t dayno,int32_t daytime,int local)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int32_t *in_RDI;
  int32_t tt;
  int32_t dd;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_2c = *in_RDI;
  iVar1 = in_RDI[1];
  if (in_ECX != 0) {
    iVar1 = **(int **)(in_RDI + 2) + *(int *)(*(long *)(in_RDI + 2) + 4) + iVar1;
    caldate_t::normalize((int32_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI);
  }
  if (local_2c == in_ESI) {
    local_2c = iVar1 - in_EDX;
  }
  else {
    local_2c = local_2c - in_ESI;
  }
  return local_2c;
}

Assistant:

int vmtz_trans::compare_to(int32_t dayno, int32_t daytime, int local) const
{
    /* get my value, converting to local time if required */
    int32_t dd = this->dayno, tt = this->daytime;
    if (local)
    {
        tt += ttype->gmtofs + ttype->save;
        caldate_t::normalize(dd, tt);
    }
    
    /* compare by day, then by time if on the same day */
    return (dd != dayno ? dd - dayno : tt - daytime);
}